

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsql_sqlite.cpp
# Opt level: O2

int qGetColumnType(QString *tpName)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  long in_FS_OFFSET;
  QLatin1String QVar4;
  QLatin1StringView local_58;
  QLatin1StringView local_48;
  QLatin1StringView local_38;
  QArrayDataPointer<char16_t> local_28;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_28.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_28.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_28.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QString::toLower_helper((QString *)&local_28);
  local_38.m_size = 7;
  local_38.m_data = "integer";
  bVar1 = operator==((QString *)&local_28,&local_38);
  if (!bVar1) {
    local_48.m_size = 3;
    local_48.m_data = "int";
    bVar1 = operator==((QString *)&local_28,&local_48);
    if (!bVar1) {
      local_38.m_size = 6;
      local_38.m_data = "double";
      bVar1 = operator==((QString *)&local_28,&local_38);
      if (!bVar1) {
        local_48.m_size = 5;
        local_48.m_data = "float";
        bVar1 = operator==((QString *)&local_28,&local_48);
        if (!bVar1) {
          local_58.m_size = 4;
          local_58.m_data = "real";
          bVar1 = operator==((QString *)&local_28,&local_58);
          if (!bVar1) {
            iVar3 = 1;
            QVar4.m_data = (char *)0x7;
            QVar4.m_size = (qsizetype)&local_28;
            cVar2 = QString::startsWith(QVar4,0x1e1595);
            if (cVar2 == '\0') {
              local_38.m_size = 4;
              local_38.m_data = "blob";
              bVar1 = operator==((QString *)&local_28,&local_38);
              if (bVar1) {
                iVar3 = 0xc;
              }
              else {
                local_38.m_size = 7;
                local_38.m_data = "boolean";
                bVar1 = operator==((QString *)&local_28,&local_38);
                if (!bVar1) {
                  local_48.m_size = 4;
                  local_48.m_data = "bool";
                  bVar1 = operator==((QString *)&local_28,&local_48);
                  iVar3 = (uint)!bVar1 + (uint)!bVar1 * 8 + 1;
                }
              }
              goto LAB_00111f32;
            }
          }
        }
      }
      iVar3 = 6;
      goto LAB_00111f32;
    }
  }
  iVar3 = 2;
LAB_00111f32:
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_10) {
    __stack_chk_fail();
  }
  return iVar3;
}

Assistant:

static int qGetColumnType(const QString &tpName)
{
    const QString typeName = tpName.toLower();

    if (typeName == "integer"_L1 || typeName == "int"_L1)
        return QMetaType::Int;
    if (typeName == "double"_L1
        || typeName == "float"_L1
        || typeName == "real"_L1
        || typeName.startsWith("numeric"_L1))
        return QMetaType::Double;
    if (typeName == "blob"_L1)
        return QMetaType::QByteArray;
    if (typeName == "boolean"_L1 || typeName == "bool"_L1)
        return QMetaType::Bool;
    return QMetaType::QString;
}